

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne.h
# Opt level: O2

uint __thiscall FastPForLib::ZRandom::getValue(ZRandom *this)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  iVar2 = this->nValues;
  if (iVar2 == 0) {
    uVar4 = this->MT[0];
    this->MT[0x270] = uVar4;
    for (lVar3 = -0x9c0; lVar3 != 0; lVar3 = lVar3 + 4) {
      uVar1 = *(uint *)((long)this->map + lVar3 + -4);
      uVar5 = (uVar1 & 0x7ffffffe | uVar4 & 0x80000000) >> 1 ^
              **(uint **)((long)&this->nValues + lVar3 * 2);
      uVar4 = uVar5 ^ 0x9908b0df;
      if ((uVar1 & 1) == 0) {
        uVar4 = uVar5;
      }
      *(uint *)((long)this->map + lVar3 + -8) = uVar4;
      uVar4 = uVar1;
    }
    iVar2 = 0x270;
  }
  this->nValues = iVar2 + -1;
  uVar4 = this->MT[0x270 - iVar2] >> 0xb ^ this->MT[0x270 - iVar2];
  uVar4 = (uVar4 & 0x13a58ad) << 7 ^ uVar4;
  uVar4 = (uVar4 & 0x1df8c) << 0xf ^ uVar4;
  return uVar4 >> 0x12 ^ uVar4;
}

Assistant:

unsigned int ZRandom::getValue() {
  if (0 == nValues) {
    MT[N] = MT[0];
    for (int i = 0; i < N; ++i) {
      unsigned y = (0x80000000 & MT[i]) | (0x7FFFFFFF & MT[i + 1]);
      unsigned v = *(map[i]) ^ (y >> 1);
      if (1 & y)
        v ^= 2567483615;
      MT[i] = v;
    }
    nValues = N;
  }
  unsigned y = MT[N - nValues--];
  y ^= y >> 11;
  y ^= (y << 7) & 2636928640U;
  y ^= (y << 15) & 4022730752U;
  y ^= y >> 18;
  return y;
}